

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O3

void __thiscall Fifteen::setTilesGraphic(Fifteen *this)

{
  ulong uVar1;
  pointer pQVar2;
  QPushButton *pQVar3;
  NumberColor numberColor;
  uint uVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar5;
  vector<QImage,_std::allocator<QImage>_> *pvVar6;
  size_t sVar7;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *pvVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong *puVar11;
  Fifteen *this_00;
  pointer puVar12;
  QByteArrayView QVar13;
  QIcon icon;
  QSize iconSize;
  QPixmap pixmap;
  QIcon aQStack_b8 [8];
  undefined4 local_b0;
  undefined4 local_ac;
  QArrayData *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  size_t local_90;
  Fifteen *local_88;
  pointer local_80;
  QArrayData *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  QPixmap local_58 [24];
  undefined4 local_40;
  
  Controller::getBoardAttributes((Controller *)&local_40);
  pvVar5 = Controller::getValues
                     ((this->controller)._M_t.
                      super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
                      super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
                      super__Head_base<0UL,_Controller_*,_false>._M_head_impl);
  puVar11 = (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pvVar6 = Controller::getImages
                     ((this->controller)._M_t.
                      super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
                      super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
                      super__Head_base<0UL,_Controller_*,_false>._M_head_impl);
  local_b0 = local_40;
  local_ac = local_40;
  sVar7 = Controller::getFontSize
                    ((this->controller)._M_t.
                     super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
                     super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
                     super__Head_base<0UL,_Controller_*,_false>._M_head_impl);
  numberColor = Options::getNumberOnImageColor();
  QIcon::QIcon(aQStack_b8);
  local_88 = this;
  pvVar8 = TilesBoard::getTiles
                     ((this->tilesBoard)._M_t.
                      super___uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_>._M_t.
                      super__Tuple_impl<0UL,_TilesBoard_*,_std::default_delete<TilesBoard>_>.
                      super__Head_base<0UL,_TilesBoard_*,_false>._M_head_impl);
  puVar12 = (pvVar8->
            super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_80 = (pvVar8->
             super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar12 != local_80) {
    local_90 = (size_t)(int)sVar7;
    do {
      uVar1 = *puVar11;
      pQVar2 = (pvVar6->super__Vector_base<QImage,_std::allocator<QImage>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = ((long)(pvVar6->super__Vector_base<QImage,_std::allocator<QImage>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pQVar2 >> 3) * -0x5555555555555555;
      if (uVar10 < uVar1 || uVar10 - uVar1 == 0) {
        uVar9 = std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
        QIcon::~QIcon(aQStack_b8);
        _Unwind_Resume(uVar9);
      }
      QPixmap::fromImage(local_58,pQVar2 + uVar1 * 0x18,0);
      if (numberColor == NO) {
LAB_0010c5e5:
        QIcon::addPixmap(aQStack_b8,local_58,0,1);
      }
      else {
        uVar1 = *puVar11;
        this_00 = (Fifteen *)
                  (local_88->controller)._M_t.
                  super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
                  super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
                  super__Head_base<0UL,_Controller_*,_false>._M_head_impl;
        uVar4 = Controller::getNullValue((Controller *)this_00);
        if (uVar1 == uVar4) goto LAB_0010c5e5;
        drawNumberOnTile(this_00,aQStack_b8,local_58,local_90,*puVar11,numberColor);
      }
      QAbstractButton::setIconSize
                ((QSize *)(puVar12->_M_t).
                          super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t
                          .super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                          super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl);
      QAbstractButton::setIcon
                ((QIcon *)(puVar12->_M_t).
                          super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t
                          .super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                          super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl);
      pQVar3 = (puVar12->_M_t).super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>
               ._M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
               super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl;
      QVar13.m_data = (storage_type *)0x0;
      QVar13.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar13);
      local_a8 = local_78;
      uStack_a0 = uStack_70;
      local_98 = local_68;
      QWidget::setStyleSheet((QString *)pQVar3);
      if (local_a8 != (QArrayData *)0x0) {
        LOCK();
        (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_a8,2,8);
        }
      }
      puVar11 = puVar11 + 1;
      QPixmap::~QPixmap(local_58);
      puVar12 = puVar12 + 1;
    } while (puVar12 != local_80);
  }
  QIcon::~QIcon(aQStack_b8);
  return;
}

Assistant:

void Fifteen::setTilesGraphic()
{
    const auto [ boardSizeInt, tileSizeInt ] = controller->getBoardAttributes();
    auto value = controller->getValues().begin();

    const auto& images = controller->getImages();
    QSize iconSize( tileSizeInt, tileSizeInt );

    int fontSizeInt = controller->getFontSize();
    NumberColor numberColor = Options::getNumberOnImageColor();
    QIcon icon;

    for ( auto& tile : tilesBoard->getTiles() )
    {
        QPixmap pixmap = QPixmap::fromImage( images.at( *value ));
        if ( numberColor == NumberColor::NO || *value == controller->getNullValue() )
        {
            icon.addPixmap( pixmap );
        }
        else
        {
            drawNumberOnTile( icon, pixmap, fontSizeInt, *value, numberColor );
        }
        tile->setIconSize( iconSize );
        tile->setIcon( icon );
        tile->setStyleSheet( "" );
        value++;
    }
}